

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ilu_relax_snode.c
# Opt level: O3

void ilu_relax_snode(int n,int *et,int relax_columns,int *descendants,int *relax_end,
                    int *relax_fsupc)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  
  ifill(relax_end,n,-1);
  ifill(relax_fsupc,n,-1);
  if (0 < n) {
    uVar7 = (ulong)(uint)n;
    uVar9 = 0;
    memset(descendants,0,uVar7 * 4);
    do {
      iVar5 = et[uVar9];
      if (iVar5 != n) {
        descendants[iVar5] = descendants[uVar9] + descendants[iVar5] + 1;
      }
      uVar9 = uVar9 + 1;
    } while (uVar7 != uVar9);
    if (0 < n) {
      lVar4 = 0;
      iVar5 = 0;
      do {
        lVar6 = (long)iVar5;
        lVar8 = lVar6;
        iVar3 = et[lVar6];
        iVar2 = iVar5;
        while (iVar1 = iVar3, iVar1 != n) {
          lVar8 = (long)iVar1;
          if (relax_columns <= descendants[lVar8]) {
            lVar8 = (long)iVar2;
            break;
          }
          iVar2 = iVar1;
          iVar3 = et[lVar8];
        }
        relax_end[lVar6] = iVar2;
        relax_fsupc[lVar4] = iVar5;
        iVar5 = (int)lVar8;
        do {
          lVar8 = lVar8 + 1;
          iVar5 = iVar5 + 1;
          if (descendants[lVar8] == 0) break;
        } while (lVar8 < (long)uVar7);
        lVar4 = lVar4 + 1;
      } while (iVar5 < n);
    }
  }
  return;
}

Assistant:

void
ilu_relax_snode (
	      const	int n,
	      const int	*et,	       /* column elimination tree */
	      const int relax_columns, /* max no of columns allowed in a
					  relaxed snode */
	      int	*descendants,  /* no of descendants of each node
					 in the etree */
	      int	*relax_end,    /* last column in a supernode
					* if j-th column starts a relaxed
					* supernode, relax_end[j] represents
					* the last column of this supernode */
	      int	*relax_fsupc   /* first column in a supernode
					* relax_fsupc[j] represents the first
					* column of j-th supernode */
	     )
{

    register int j, f, parent;
    register int snode_start;	/* beginning of a snode */

    ifill (relax_end, n, SLU_EMPTY);
    ifill (relax_fsupc, n, SLU_EMPTY);
    for (j = 0; j < n; j++) descendants[j] = 0;

    /* Compute the number of descendants of each node in the etree */
    for (j = 0; j < n; j++) {
	parent = et[j];
	if ( parent != n )  /* not the dummy root */
	    descendants[parent] += descendants[j] + 1;
    }

    /* Identify the relaxed supernodes by postorder traversal of the etree. */
    for (j = f = 0; j < n; ) {
	parent = et[j];
	snode_start = j;
	while ( parent != n && descendants[parent] < relax_columns ) {
	    j = parent;
	    parent = et[j];
	}
	/* Found a supernode with j being the last column. */
	relax_end[snode_start] = j;		/* Last column is recorded */
	j++;
	relax_fsupc[f++] = snode_start;
	/* Search for a new leaf */
	while ( descendants[j] != 0 && j < n ) j++;
    }
}